

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

bool google::protobuf::compiler::java::NestedInFileClass(EnumDescriptor *descriptor,bool immutable)

{
  byte bVar1;
  undefined8 extraout_RAX;
  ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
  *in_RCX;
  JavaFeatures local_48;
  
  ValidateNestInFileClassFeature((java *)&local_48,descriptor);
  if ((StatusRep *)local_48.super_Message.super_MessageLite._vptr_MessageLite != (StatusRep *)0x1) {
    absl::lts_20250127::status_internal::MakeCheckFailString
              ((Nonnull<const_absl::Status_*>)&local_48,
               "ValidateNestInFileClassFeature(descriptor) is OK");
  }
  if (((ulong)local_48.super_Message.super_MessageLite._vptr_MessageLite & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref
              ((StatusRep *)local_48.super_Message.super_MessageLite._vptr_MessageLite);
  }
  if ((StatusRep *)local_48.super_Message.super_MessageLite._vptr_MessageLite != (StatusRep *)0x1) {
LAB_00e298e6:
    NestedInFileClass();
    __clang_call_terminate(extraout_RAX);
  }
  protobuf::internal::InternalFeatureHelper::
  GetResolvedFeatureExtension<google::protobuf::EnumDescriptor,pb::JavaFeatures,(unsigned_char)11,false>
            (&local_48,(InternalFeatureHelper *)descriptor,(EnumDescriptor *)&pb::java,in_RCX);
  pb::JavaFeatures::~JavaFeatures(&local_48);
  if (local_48.field_0._impl_.nest_in_file_class_ == 3) {
    bVar1 = (descriptor->file_->options_->field_0)._impl_.java_multiple_files_ ^ 1;
  }
  else {
    bVar1 = 1;
    if (local_48.field_0._impl_.nest_in_file_class_ != 2) {
      if (local_48.field_0._impl_.nest_in_file_class_ == 0) {
        NestedInFileClass((java *)&local_48);
        goto LAB_00e298e6;
      }
      bVar1 = 0;
    }
  }
  return (bool)bVar1;
}

Assistant:

bool NestedInFileClass(const EnumDescriptor& descriptor, bool immutable) {
  ABSL_CHECK_OK(ValidateNestInFileClassFeature(descriptor));
  return NestInFileClass(descriptor, immutable);
}